

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void bribe_prog_cityguard(CHAR_DATA *mob,CHAR_DATA *ch,int amount)

{
  if (amount < 100) {
    do_say(mob,"You cheapskate!!!");
    do_murder(mob,ch->name);
    return;
  }
  if (4999 < (uint)amount) {
    interpret(mob,"wink");
    do_sleep(mob,"");
    return;
  }
  do_say(mob,"Trying to bribe me, eh? It\'ll cost ya more than that.");
  return;
}

Assistant:

void bribe_prog_cityguard(CHAR_DATA *mob, CHAR_DATA *ch, int amount)
{
	if (amount < 100)
	{
		do_say(mob, "You cheapskate!!!");
		do_murder(mob, ch->name);
	}
	else if (amount >= 5000)
	{
		interpret(mob, "wink");
		do_sleep(mob, "");
	}
	else
	{
		do_say(mob, "Trying to bribe me, eh? It'll cost ya more than that.");
	}
}